

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O3

MatrixXd * __thiscall
lf::geometry::QuadO1::JacobianInverseGramian
          (MatrixXd *__return_storage_ptr__,QuadO1 *this,MatrixXd *local)

{
  Index IVar1;
  long cols;
  Matrix<double,__1,_4,_0,__1,_4> *pMVar2;
  undefined1 auVar3 [8];
  Matrix<double,__1,__1,_0,__1,__1> *pMVar4;
  uint uVar5;
  int iVar6;
  CoeffReturnType pdVar7;
  long lVar8;
  MatrixXd jacobian;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator_2;
  SrcEvaluatorType srcEvaluator_2;
  assign_op<double,_double> local_5e1;
  Matrix<double,__1,_4,_0,__1,_4> *local_5e0;
  MatrixXd *local_5d8;
  long local_5d0;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_5c8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_5a8;
  Lhs local_588;
  Lhs local_550;
  DstEvaluatorType local_518;
  Rhs local_500;
  undefined1 local_4c8 [8];
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_4c0;
  scalar_constant_op<double> local_4b8;
  PointerType local_4b0;
  Index local_4a0;
  PointerType local_498;
  Index local_488;
  double local_480;
  PointerType local_460;
  Index local_450;
  PointerType local_448;
  Index local_438;
  double local_430;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_420;
  MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> local_3e8;
  Matrix<double,__1,_4,_0,__1,_4> *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  Index local_3b8;
  undefined1 local_3b0 [96];
  XprTypeNested local_350;
  variable_if_dynamic<long,__1> local_348;
  scalar_constant_op<double> local_318;
  PointerType local_300;
  XprTypeNested local_2e8;
  PointerType local_2c8;
  XprTypeNested local_2b0;
  scalar_constant_op<double> local_278;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
  local_260;
  undefined1 local_1e8 [160];
  undefined1 local_148 [64];
  variable_if_dynamic<long,__1> local_108;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_d0;
  
  uVar5 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
  lVar8 = (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  local_5d8 = __return_storage_ptr__;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,(ulong)uVar5,
             lVar8 * 2);
  uVar5 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
  local_5c8.m_storage.m_data = (double *)0x0;
  local_5c8.m_storage.m_rows = 0;
  local_5c8.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&local_5c8,(ulong)uVar5,2);
  if (0 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
     ) {
    local_5e0 = &this->coords_;
    local_5d0 = 0;
    lVar8 = 0;
    do {
      IVar1 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_588,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data + IVar1,IVar1,1);
      pMVar2 = local_5e0;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           local_5e0;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 1;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
           m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase(&local_3e8,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data,
              local_588.
              super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
              .m_outerStride,1);
      local_3d0 = pMVar2;
      local_3c8 = 0;
      uStack_3c0 = 0;
      local_3b8 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                  m_storage.m_rows;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                       *)local_148,&local_588,(Rhs *)&local_3e8,
                      (scalar_difference_op<double,_double> *)local_4c8);
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)local,1,
                          lVar8);
      local_1e8._0_8_ = 1.0 - *pdVar7;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_4c8,local_108.m_value,1,(scalar_constant_op<double> *)local_1e8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp(&local_d0,(Lhs *)local_148,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_4c8,(scalar_product_op<double,_double> *)&local_260);
      IVar1 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_550,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data + IVar1 * 2,IVar1,1);
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           local_5e0;
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 2;
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
           m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_500,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data +
              local_550.
              super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
              .m_outerStride * 3,
              local_550.
              super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
              .m_outerStride,1);
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           local_5e0;
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 3;
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
           m_rows;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp(&local_260,&local_550,&local_500,
                      (scalar_difference_op<double,_double> *)local_4c8);
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)local,1,
                          lVar8);
      local_420.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)*pdVar7;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_4c8,
                       local_260.m_rhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                       .m_rows.m_value,1,(scalar_constant_op<double> *)&local_420);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_1e8,&local_260,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_4c8,(scalar_product_op<double,_double> *)&local_5a8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                       *)local_3b0,&local_d0,(Rhs *)local_1e8,
                      (scalar_sum_op<double,_double> *)local_4c8);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_420,(Matrix<double,__1,__1,_0,__1,__1> *)&local_5c8,0);
      local_4b0 = (PointerType)local_3b0._16_8_;
      local_4a0 = *(Index *)(local_3b0._40_8_ + 8);
      local_498 = (PointerType)local_3b0._72_8_;
      local_488 = (local_350->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_480 = local_318.m_other;
      local_460 = local_300;
      local_450 = (local_2e8->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_448 = local_2c8;
      local_438 = (local_2b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_430 = local_278.m_other;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>,double,double>
                (&local_420,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_3b0,&local_5e1);
      local_518.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_420.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                .m_data;
      local_518.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           ((local_420.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
      local_5a8.m_dst = &local_518;
      local_5a8.m_functor = &local_5e1;
      local_5a8.m_src = (SrcEvaluatorType *)local_4c8;
      local_5a8.m_dstExpr = &local_420;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
      ::run(&local_5a8);
      IVar1 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_588,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data + IVar1 * 3,IVar1,1);
      pMVar2 = local_5e0;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           local_5e0;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 3;
      local_588.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
           m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase(&local_3e8,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data,
              local_588.
              super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
              .m_outerStride,1);
      local_3d0 = pMVar2;
      local_3c8 = 0;
      uStack_3c0 = 0;
      local_3b8 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
                  m_storage.m_rows;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>
                       *)local_148,&local_588,(Rhs *)&local_3e8,
                      (scalar_difference_op<double,_double> *)local_4c8);
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)local,0,
                          lVar8);
      local_1e8._0_8_ = 1.0 - *pdVar7;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_4c8,local_108.m_value,1,(scalar_constant_op<double> *)local_1e8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp(&local_d0,(Lhs *)local_148,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_4c8,(scalar_product_op<double,_double> *)&local_260);
      IVar1 = (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_550,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data + IVar1 * 2,IVar1,1);
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           local_5e0;
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 2;
      local_550.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
           m_rows;
      Eigen::MapBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_0>::
      MapBase((MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0> *
              )&local_500,
              (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.
              m_storage.m_data +
              local_550.
              super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
              .m_outerStride,
              local_550.
              super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
              .m_outerStride,1);
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.m_xpr =
           local_5e0;
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startRow.m_value = 0;
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_startCol.m_value = 1;
      local_500.
      super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
      m_outerStride =
           (this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>.m_storage.
           m_rows;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>
      ::CwiseBinaryOp(&local_260,&local_550,&local_500,
                      (scalar_difference_op<double,_double> *)local_4c8);
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)local,0,
                          lVar8);
      local_420.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
      .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>.m_data =
           (PointerType)*pdVar7;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)local_4c8,
                       local_260.m_rhs.
                       super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                       .
                       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                       .m_rows.m_value,1,(scalar_constant_op<double> *)&local_420);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)local_1e8,&local_260,
                      (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)local_4c8,(scalar_product_op<double,_double> *)&local_5a8);
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                       *)local_3b0,&local_d0,(Rhs *)local_1e8,
                      (scalar_sum_op<double,_double> *)local_4c8);
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                (&local_420,(Matrix<double,__1,__1,_0,__1,__1> *)&local_5c8,1);
      local_4b0 = (PointerType)local_3b0._16_8_;
      local_4a0 = *(Index *)(local_3b0._40_8_ + 8);
      local_498 = (PointerType)local_3b0._72_8_;
      local_488 = (local_350->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_480 = local_318.m_other;
      local_460 = local_300;
      local_450 = (local_2e8->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_448 = local_2c8;
      local_438 = (local_2b0->super_PlainObjectBase<Eigen::Matrix<double,__1,_4,_0,__1,_4>_>).
                  m_storage.m_rows;
      local_430 = local_278.m_other;
      Eigen::internal::
      resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const,Eigen::Block<Eigen::Matrix<double,_1,4,0,_1,4>const,_1,1,true>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>const>,double,double>
                (&local_420,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_3b0,&local_5e1);
      local_518.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = local_420.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                .m_data;
      local_518.super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value =
           ((local_420.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
            m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
      local_5a8.m_dst = &local_518;
      local_5a8.m_functor = &local_5e1;
      local_5a8.m_src = (SrcEvaluatorType *)local_4c8;
      local_5a8.m_dstExpr = &local_420;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_4,_0,_-1,_4>,_-1,_1,_true>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
      ::run(&local_5a8);
      iVar6 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
      if (iVar6 == 2) {
        local_d0._0_8_ = &local_5c8;
        local_4c8 = (undefined1  [8])
                    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                    ::inverse((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                               *)&local_d0);
        uVar5 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_3b0,
                   local_5d8,0,local_5d0,(ulong)uVar5,2);
        Eigen::internal::
        Assignment<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
        ::run((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_3b0,
              (SrcXprType *)local_4c8,(assign_op<double,_double> *)local_1e8);
      }
      else {
        local_3e8.m_data = (PointerType)&local_5c8;
        Eigen::
        Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>
        ::Product((Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                   *)local_4c8,(Lhs *)&local_3e8,(Rhs *)local_3e8.m_data);
        pMVar4 = pMStack_4c0;
        auVar3 = local_4c8;
        local_588.
        super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.
        m_data = (PointerType)local_4c8;
        local_588.
        super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.
        m_rows.m_value = (long)pMStack_4c0;
        local_4c8 = (undefined1  [8])0x0;
        pMStack_4c0 = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
        local_4b8.m_other = 0.0;
        cols = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
        if (*(Index *)((long)auVar3 + 0x10) != 0 || cols != 0) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4c8,
                     *(Index *)((long)auVar3 + 0x10),cols);
        }
        Eigen::internal::
        generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
        ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_4c8,
                   (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_588,
                   (Matrix<double,__1,__1,_0,__1,__1> *)
                   local_588.
                   super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                   .
                   super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                   .
                   super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                   .m_rows.m_value);
        Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3b0,
                   (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_4c8);
        free((void *)local_4c8);
        local_550.
        super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.
        m_data = (PointerType)&local_5c8;
        Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
        _check_solve_assertion<false,Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>
                  ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                   local_3b0,
                   (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                   &local_550);
        local_260.m_lhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.
        m_data = (PointerType)local_3b0;
        local_260.m_lhs.
        super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>.
        super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>.
        super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>.
        m_rows.m_value = (long)&local_550;
        uVar5 = (*(this->super_Geometry)._vptr_Geometry[1])(this);
        Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_4c8,
                   local_5d8,0,local_5d0,(ulong)uVar5,2);
        Eigen::internal::
        evaluator<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
        ::evaluator((evaluator<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                     *)&local_d0,(SolveType *)&local_260);
        Eigen::internal::
        resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Transpose<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>const>,double,double>
                  ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_4c8,
                   (Transpose<const_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)&local_260,(assign_op<double,_double> *)&local_500);
        local_148._0_8_ = local_4c8;
        local_148._16_8_ = local_4b0[1];
        local_1e8._0_8_ = local_148;
        local_1e8._8_8_ = &local_d0;
        local_1e8._16_8_ = (assign_op<double,_double> *)&local_500;
        local_1e8._24_8_ =
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_4c8;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<const_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Transpose<const_Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)local_1e8);
        free((void *)local_d0.m_lhs.m_lhs.
                     super_BlockImpl<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true,_true>
                     .
                     super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_4,_0,__1,_4>,__1,_1,_true>,_0>
                     .m_rows.m_value);
        free((void *)local_348.m_value);
        free((void *)local_3b0._88_8_);
        free((void *)local_3b0._72_8_);
        free((void *)local_3b0._56_8_);
        free((void *)local_3b0._40_8_);
        free((void *)local_3b0._24_8_);
        free((void *)local_3b0._0_8_);
      }
      lVar8 = lVar8 + 1;
      local_5d0 = local_5d0 + 2;
    } while (lVar8 < (local->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_cols);
  }
  free(local_5c8.m_storage.m_data);
  return local_5d8;
}

Assistant:

Eigen::MatrixXd QuadO1::JacobianInverseGramian(
    const Eigen::MatrixXd& local) const {
  Eigen::MatrixXd result(DimGlobal(), local.cols() * 2);
  Eigen::MatrixXd jacobian(DimGlobal(), 2);

  // Loop over all evaluatin points
  for (Eigen::Index i = 0; i < local.cols(); ++i) {
    // Compute Jacobian matrix in one evaluation point.
    jacobian.col(0) = (coords_.col(1) - coords_.col(0)) * (1 - local(1, i)) +
                      (coords_.col(2) - coords_.col(3)) * local(1, i);
    jacobian.col(1) = (coords_.col(3) - coords_.col(0)) * (1 - local(0, i)) +
                      (coords_.col(2) - coords_.col(1)) * local(0, i);
    // Distinguish whether the cell lies in a planar mesh or a surface mesh
    if (DimGlobal() == 2) {
      // Standard case: 2D planar mesh
      // Eigen has a built-in function for computing the inverse of a small
      // matrix
      result.block(0, 2 * i, DimGlobal(), 2) = jacobian.transpose().inverse();
    } else {
      result.block(0, 2 * i, DimGlobal(), 2) = (jacobian.transpose() * jacobian)
                                                   .colPivHouseholderQr()
                                                   .solve(jacobian.transpose())
                                                   .transpose();
    }
  }
  return result;
}